

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceManager.cpp
# Opt level: O1

void __thiscall
OpenMD::ForceManager::selectedShortRangeInteractions
          (ForceManager *this,Molecule *mol1,Molecule *mol2)

{
  _Rb_tree_header *p_Var1;
  InversionType *pIVar2;
  pointer ppAVar3;
  long lVar4;
  _Base_ptr p_Var5;
  Snapshot *this_00;
  double dVar6;
  _Base_ptr p_Var7;
  _Rb_tree_header *p_Var8;
  ulong uVar9;
  pointer ppTVar10;
  pointer ppIVar11;
  ulong uVar12;
  RigidBody *pRVar13;
  Bond *pBVar14;
  Inversion *pIVar15;
  pointer ppRVar16;
  pointer ppBVar17;
  pointer ppBVar18;
  RealType angle;
  RealType torsionPotential;
  RealType bendPotential;
  RealType bondPotential;
  RealType inversionPotential;
  RealType local_110;
  _Rb_tree<OpenMD::Bend*,std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>,std::_Select1st<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>,std::less<OpenMD::Bend*>,std::allocator<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>>
  *local_108;
  Molecule *local_100;
  pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet> local_f8;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78 [2];
  potVec local_68;
  
  pRVar13 = (RigidBody *)0x0;
  local_b8 = 0.0;
  local_c0 = 0.0;
  local_c8 = 0.0;
  local_b0 = 0.0;
  local_78[0] = 0.0;
  local_88 = 0.0;
  dStack_80 = 0.0;
  local_98 = 0.0;
  dStack_90 = 0.0;
  local_a8 = 0.0;
  dStack_a0 = 0.0;
  ppRVar16 = (mol1->rigidBodies_).
             super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_100 = mol2;
  if (ppRVar16 !=
      (mol1->rigidBodies_).
      super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pRVar13 = *ppRVar16;
  }
  while (pRVar13 != (RigidBody *)0x0) {
    ppRVar16 = ppRVar16 + 1;
    RigidBody::updateAtoms(pRVar13);
    if (ppRVar16 ==
        (mol1->rigidBodies_).
        super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pRVar13 = (RigidBody *)0x0;
    }
    else {
      pRVar13 = *ppRVar16;
    }
  }
  ppBVar17 = (mol1->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppBVar17 ==
      (mol1->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pBVar14 = (Bond *)0x0;
  }
  else {
    pBVar14 = *ppBVar17;
  }
  while (pBVar14 != (Bond *)0x0) {
    ppBVar17 = ppBVar17 + 1;
    Bond::calcForce(pBVar14,this->doParticlePot_);
    local_b8 = local_b8 + pBVar14->potential_;
    if (this->doPotentialSelection_ == true) {
      ppAVar3 = (pBVar14->super_ShortRangeInteraction).atoms_.
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar12 = (ulong)((*ppAVar3)->super_StuntDouble).globalIndex_;
      lVar4 = *(long *)&(((this->seleMan_).ss_.bitsets_.
                          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                          ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                        super__Bvector_base<std::allocator<bool>_>;
      uVar9 = uVar12 + 0x3f;
      if (-1 < (long)uVar12) {
        uVar9 = uVar12;
      }
      if ((*(ulong *)(lVar4 + ((long)uVar9 >> 6) * 8 + -8 +
                     (ulong)((uVar12 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
           (uVar12 & 0x3f) & 1) == 0) {
        uVar12 = (ulong)(ppAVar3[1]->super_StuntDouble).globalIndex_;
        uVar9 = uVar12 + 0x3f;
        if (-1 < (long)uVar12) {
          uVar9 = uVar12;
        }
        if ((*(ulong *)(lVar4 + ((long)uVar9 >> 6) * 8 + -8 +
                       (ulong)((uVar12 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
             (uVar12 & 0x3f) & 1) == 0) goto LAB_0012f304;
      }
      local_78[0] = pBVar14->potential_ + local_78[0];
    }
LAB_0012f304:
    if (ppBVar17 ==
        (mol1->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pBVar14 = (Bond *)0x0;
    }
    else {
      pBVar14 = *ppBVar17;
    }
  }
  ppBVar18 = (mol1->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppBVar18 ==
      (mol1->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pIVar15 = (Inversion *)0x0;
  }
  else {
    pIVar15 = (Inversion *)*ppBVar18;
  }
  if (pIVar15 != (Inversion *)0x0) {
    local_108 = (_Rb_tree<OpenMD::Bend*,std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>,std::_Select1st<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>,std::less<OpenMD::Bend*>,std::allocator<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>>
                 *)&this->bendDataSets;
    p_Var1 = &(this->bendDataSets)._M_t._M_impl.super__Rb_tree_header;
    do {
      (*(pIVar15->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[9])
                (pIVar15,&local_110,(ulong)this->doParticlePot_);
      pIVar2 = pIVar15->inversionType_;
      local_c0 = local_c0 + (double)pIVar2;
      p_Var5 = (this->bendDataSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var7 = &p_Var1->_M_header;
      for (; (_Rb_tree_header *)p_Var5 != (_Rb_tree_header *)0x0;
          p_Var5 = (&p_Var5->_M_left)[*(Inversion **)(p_Var5 + 1) < pIVar15]) {
        if (*(Inversion **)(p_Var5 + 1) >= pIVar15) {
          p_Var7 = p_Var5;
        }
      }
      p_Var8 = p_Var1;
      if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
         (p_Var8 = (_Rb_tree_header *)p_Var7,
         pIVar15 < (Inversion *)((_Rb_tree_header *)p_Var7)->_M_node_count)) {
        p_Var8 = p_Var1;
      }
      if (p_Var8 == p_Var1) {
        local_f8.second.deltaV = 0.0;
        local_f8.second.prev.angle = local_110;
        local_f8.second.curr.angle = local_110;
        local_f8.first = pIVar15;
        local_f8.second.prev.potential = (RealType)pIVar2;
        local_f8.second.curr.potential = (RealType)pIVar2;
        std::
        _Rb_tree<OpenMD::Bend*,std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>,std::_Select1st<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>,std::less<OpenMD::Bend*>,std::allocator<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>>
        ::_M_insert_unique<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>
                  (local_108,(pair<OpenMD::Bend_*const,_OpenMD::BendDataSet> *)&local_f8);
      }
      else {
        dVar6 = *(double *)((long)(p_Var8 + 1) + 0x20);
        *(undefined8 *)((long)(p_Var8 + 1) + 8) = *(undefined8 *)((long)(p_Var8 + 1) + 0x18);
        *(double *)((long)(p_Var8 + 1) + 0x10) = dVar6;
        *(RealType *)((long)(p_Var8 + 1) + 0x18) = local_110;
        *(InversionType **)((long)(p_Var8 + 1) + 0x20) = pIVar2;
        *(double *)(p_Var8 + 1) = ABS((double)pIVar2 - dVar6);
      }
      if (this->doPotentialSelection_ == true) {
        ppAVar3 = (pIVar15->super_ShortRangeInteraction).atoms_.
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar12 = (ulong)((*ppAVar3)->super_StuntDouble).globalIndex_;
        lVar4 = *(long *)&(((this->seleMan_).ss_.bitsets_.
                            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                            ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                          super__Bvector_base<std::allocator<bool>_>;
        uVar9 = uVar12 + 0x3f;
        if (-1 < (long)uVar12) {
          uVar9 = uVar12;
        }
        if ((*(ulong *)(lVar4 + ((long)uVar9 >> 6) * 8 + -8 +
                       (ulong)((uVar12 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
             (uVar12 & 0x3f) & 1) == 0) {
          uVar12 = (ulong)(ppAVar3[1]->super_StuntDouble).globalIndex_;
          uVar9 = uVar12 + 0x3f;
          if (-1 < (long)uVar12) {
            uVar9 = uVar12;
          }
          if ((*(ulong *)(lVar4 + ((long)uVar9 >> 6) * 8 + -8 +
                         (ulong)((uVar12 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
               (uVar12 & 0x3f) & 1) == 0) {
            uVar12 = (ulong)(ppAVar3[2]->super_StuntDouble).globalIndex_;
            uVar9 = uVar12 + 0x3f;
            if (-1 < (long)uVar12) {
              uVar9 = uVar12;
            }
            if ((*(ulong *)(lVar4 + ((long)uVar9 >> 6) * 8 + -8 +
                           (ulong)((uVar12 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                 (uVar12 & 0x3f) & 1) == 0) goto LAB_0012f518;
          }
        }
        local_78[0] = (double)pIVar15->inversionType_ + local_78[0];
      }
LAB_0012f518:
      ppBVar18 = ppBVar18 + 1;
      if (ppBVar18 ==
          (mol1->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl
          .super__Vector_impl_data._M_finish) {
        pIVar15 = (Inversion *)0x0;
      }
      else {
        pIVar15 = (Inversion *)*ppBVar18;
      }
    } while (pIVar15 != (Inversion *)0x0);
  }
  ppTVar10 = (mol1->torsions_).
             super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppTVar10 ==
      (mol1->torsions_).super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pIVar15 = (Inversion *)0x0;
  }
  else {
    pIVar15 = (Inversion *)*ppTVar10;
  }
  if (pIVar15 != (Inversion *)0x0) {
    local_108 = (_Rb_tree<OpenMD::Bend*,std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>,std::_Select1st<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>,std::less<OpenMD::Bend*>,std::allocator<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>>
                 *)&this->torsionDataSets;
    p_Var1 = &(this->torsionDataSets)._M_t._M_impl.super__Rb_tree_header;
    do {
      (*(pIVar15->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[9])
                (pIVar15,&local_110,(ulong)this->doParticlePot_);
      pIVar2 = *(InversionType **)((long)&(pIVar15->name_).field_2 + 8);
      local_c8 = local_c8 + (double)pIVar2;
      p_Var5 = (this->torsionDataSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var7 = &p_Var1->_M_header;
      for (; (_Rb_tree_header *)p_Var5 != (_Rb_tree_header *)0x0;
          p_Var5 = (&p_Var5->_M_left)[*(Inversion **)(p_Var5 + 1) < pIVar15]) {
        if (*(Inversion **)(p_Var5 + 1) >= pIVar15) {
          p_Var7 = p_Var5;
        }
      }
      p_Var8 = p_Var1;
      if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
         (p_Var8 = (_Rb_tree_header *)p_Var7,
         pIVar15 < (Inversion *)((_Rb_tree_header *)p_Var7)->_M_node_count)) {
        p_Var8 = p_Var1;
      }
      if (p_Var8 == p_Var1) {
        local_f8.second.deltaV = 0.0;
        local_f8.second.prev.angle = local_110;
        local_f8.second.curr.angle = local_110;
        local_f8.first = pIVar15;
        local_f8.second.prev.potential = (RealType)pIVar2;
        local_f8.second.curr.potential = (RealType)pIVar2;
        std::
        _Rb_tree<OpenMD::Torsion*,std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>,std::_Select1st<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>,std::less<OpenMD::Torsion*>,std::allocator<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>>
        ::_M_insert_unique<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>
                  ((_Rb_tree<OpenMD::Torsion*,std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>,std::_Select1st<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>,std::less<OpenMD::Torsion*>,std::allocator<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>>
                    *)local_108,(pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet> *)&local_f8);
      }
      else {
        dVar6 = *(double *)((long)(p_Var8 + 1) + 0x20);
        *(undefined8 *)((long)(p_Var8 + 1) + 8) = *(undefined8 *)((long)(p_Var8 + 1) + 0x18);
        *(double *)((long)(p_Var8 + 1) + 0x10) = dVar6;
        *(RealType *)((long)(p_Var8 + 1) + 0x18) = local_110;
        *(InversionType **)((long)(p_Var8 + 1) + 0x20) = pIVar2;
        *(double *)(p_Var8 + 1) = ABS((double)pIVar2 - dVar6);
      }
      if (this->doPotentialSelection_ == true) {
        ppAVar3 = (pIVar15->super_ShortRangeInteraction).atoms_.
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar12 = (ulong)((*ppAVar3)->super_StuntDouble).globalIndex_;
        lVar4 = *(long *)&(((this->seleMan_).ss_.bitsets_.
                            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                            ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                          super__Bvector_base<std::allocator<bool>_>;
        uVar9 = uVar12 + 0x3f;
        if (-1 < (long)uVar12) {
          uVar9 = uVar12;
        }
        if ((*(ulong *)(lVar4 + ((long)uVar9 >> 6) * 8 + -8 +
                       (ulong)((uVar12 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
             (uVar12 & 0x3f) & 1) == 0) {
          uVar12 = (ulong)(ppAVar3[1]->super_StuntDouble).globalIndex_;
          uVar9 = uVar12 + 0x3f;
          if (-1 < (long)uVar12) {
            uVar9 = uVar12;
          }
          if ((*(ulong *)(lVar4 + ((long)uVar9 >> 6) * 8 + -8 +
                         (ulong)((uVar12 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
               (uVar12 & 0x3f) & 1) == 0) {
            uVar12 = (ulong)(ppAVar3[2]->super_StuntDouble).globalIndex_;
            uVar9 = uVar12 + 0x3f;
            if (-1 < (long)uVar12) {
              uVar9 = uVar12;
            }
            if ((*(ulong *)(lVar4 + ((long)uVar9 >> 6) * 8 + -8 +
                           (ulong)((uVar12 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                 (uVar12 & 0x3f) & 1) == 0) {
              uVar12 = (ulong)(ppAVar3[3]->super_StuntDouble).globalIndex_;
              uVar9 = uVar12 + 0x3f;
              if (-1 < (long)uVar12) {
                uVar9 = uVar12;
              }
              if ((*(ulong *)(lVar4 + ((long)uVar9 >> 6) * 8 + -8 +
                             (ulong)((uVar12 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                   (uVar12 & 0x3f) & 1) == 0) goto LAB_0012f76d;
            }
          }
        }
        local_78[0] = *(double *)((long)&(pIVar15->name_).field_2 + 8) + local_78[0];
      }
LAB_0012f76d:
      ppTVar10 = ppTVar10 + 1;
      if (ppTVar10 ==
          (mol1->torsions_).
          super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pIVar15 = (Inversion *)0x0;
      }
      else {
        pIVar15 = (Inversion *)*ppTVar10;
      }
    } while (pIVar15 != (Inversion *)0x0);
  }
  ppIVar11 = (mol1->inversions_).
             super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppIVar11 ==
      (mol1->inversions_).
      super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pIVar15 = (Inversion *)0x0;
  }
  else {
    pIVar15 = *ppIVar11;
  }
  if (pIVar15 != (Inversion *)0x0) {
    local_108 = (_Rb_tree<OpenMD::Bend*,std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>,std::_Select1st<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>,std::less<OpenMD::Bend*>,std::allocator<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>>
                 *)&this->inversionDataSets;
    p_Var1 = &(this->inversionDataSets)._M_t._M_impl.super__Rb_tree_header;
    do {
      (*(pIVar15->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[9])
                (pIVar15,&local_110,(ulong)this->doParticlePot_);
      pIVar2 = (InversionType *)pIVar15->potential_;
      local_b0 = local_b0 + (double)pIVar2;
      p_Var5 = (this->inversionDataSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var7 = &p_Var1->_M_header;
      for (; (_Rb_tree_header *)p_Var5 != (_Rb_tree_header *)0x0;
          p_Var5 = (&p_Var5->_M_left)[*(Inversion **)(p_Var5 + 1) < pIVar15]) {
        if (*(Inversion **)(p_Var5 + 1) >= pIVar15) {
          p_Var7 = p_Var5;
        }
      }
      p_Var8 = p_Var1;
      if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
         (p_Var8 = (_Rb_tree_header *)p_Var7,
         pIVar15 < (Inversion *)((_Rb_tree_header *)p_Var7)->_M_node_count)) {
        p_Var8 = p_Var1;
      }
      if (p_Var8 == p_Var1) {
        local_f8.second.deltaV = 0.0;
        local_f8.second.prev.angle = local_110;
        local_f8.second.curr.angle = local_110;
        local_f8.first = pIVar15;
        local_f8.second.prev.potential = (RealType)pIVar2;
        local_f8.second.curr.potential = (RealType)pIVar2;
        std::
        _Rb_tree<OpenMD::Inversion*,std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>,std::_Select1st<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>,std::less<OpenMD::Inversion*>,std::allocator<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>>
        ::_M_insert_unique<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>
                  ((_Rb_tree<OpenMD::Inversion*,std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>,std::_Select1st<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>,std::less<OpenMD::Inversion*>,std::allocator<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>>
                    *)local_108,&local_f8);
      }
      else {
        dVar6 = *(double *)((long)(p_Var8 + 1) + 0x20);
        *(undefined8 *)((long)(p_Var8 + 1) + 8) = *(undefined8 *)((long)(p_Var8 + 1) + 0x18);
        *(double *)((long)(p_Var8 + 1) + 0x10) = dVar6;
        *(RealType *)((long)(p_Var8 + 1) + 0x18) = local_110;
        *(InversionType **)((long)(p_Var8 + 1) + 0x20) = pIVar2;
        *(double *)(p_Var8 + 1) = ABS((double)pIVar2 - dVar6);
      }
      if (this->doPotentialSelection_ == true) {
        ppAVar3 = (pIVar15->super_ShortRangeInteraction).atoms_.
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar12 = (ulong)((*ppAVar3)->super_StuntDouble).globalIndex_;
        lVar4 = *(long *)&(((this->seleMan_).ss_.bitsets_.
                            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                            ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                          super__Bvector_base<std::allocator<bool>_>;
        uVar9 = uVar12 + 0x3f;
        if (-1 < (long)uVar12) {
          uVar9 = uVar12;
        }
        if ((*(ulong *)(lVar4 + ((long)uVar9 >> 6) * 8 + -8 +
                       (ulong)((uVar12 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
             (uVar12 & 0x3f) & 1) == 0) {
          uVar12 = (ulong)(ppAVar3[1]->super_StuntDouble).globalIndex_;
          uVar9 = uVar12 + 0x3f;
          if (-1 < (long)uVar12) {
            uVar9 = uVar12;
          }
          if ((*(ulong *)(lVar4 + ((long)uVar9 >> 6) * 8 + -8 +
                         (ulong)((uVar12 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
               (uVar12 & 0x3f) & 1) == 0) {
            uVar12 = (ulong)(ppAVar3[2]->super_StuntDouble).globalIndex_;
            uVar9 = uVar12 + 0x3f;
            if (-1 < (long)uVar12) {
              uVar9 = uVar12;
            }
            if ((*(ulong *)(lVar4 + ((long)uVar9 >> 6) * 8 + -8 +
                           (ulong)((uVar12 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                 (uVar12 & 0x3f) & 1) == 0) {
              uVar12 = (ulong)(ppAVar3[3]->super_StuntDouble).globalIndex_;
              uVar9 = uVar12 + 0x3f;
              if (-1 < (long)uVar12) {
                uVar9 = uVar12;
              }
              if ((*(ulong *)(lVar4 + ((long)uVar9 >> 6) * 8 + -8 +
                             (ulong)((uVar12 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                   (uVar12 & 0x3f) & 1) == 0) goto LAB_0012f9c3;
            }
          }
        }
        local_78[0] = pIVar15->potential_ + local_78[0];
      }
LAB_0012f9c3:
      ppIVar11 = ppIVar11 + 1;
      if (ppIVar11 ==
          (mol1->inversions_).
          super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pIVar15 = (Inversion *)0x0;
      }
      else {
        pIVar15 = *ppIVar11;
      }
    } while (pIVar15 != (Inversion *)0x0);
  }
  ppRVar16 = (local_100->rigidBodies_).
             super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppRVar16 ==
      (local_100->rigidBodies_).
      super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pRVar13 = (RigidBody *)0x0;
  }
  else {
    pRVar13 = *ppRVar16;
  }
  while (pRVar13 != (RigidBody *)0x0) {
    ppRVar16 = ppRVar16 + 1;
    RigidBody::updateAtoms(pRVar13);
    if (ppRVar16 ==
        (local_100->rigidBodies_).
        super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pRVar13 = (RigidBody *)0x0;
    }
    else {
      pRVar13 = *ppRVar16;
    }
  }
  ppBVar17 = (local_100->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppBVar17 ==
      (local_100->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pBVar14 = (Bond *)0x0;
  }
  else {
    pBVar14 = *ppBVar17;
  }
  while (pBVar14 != (Bond *)0x0) {
    ppBVar17 = ppBVar17 + 1;
    Bond::calcForce(pBVar14,this->doParticlePot_);
    local_b8 = local_b8 + pBVar14->potential_;
    if (this->doPotentialSelection_ == true) {
      ppAVar3 = (pBVar14->super_ShortRangeInteraction).atoms_.
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar12 = (ulong)((*ppAVar3)->super_StuntDouble).globalIndex_;
      lVar4 = *(long *)&(((this->seleMan_).ss_.bitsets_.
                          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                          ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                        super__Bvector_base<std::allocator<bool>_>;
      uVar9 = uVar12 + 0x3f;
      if (-1 < (long)uVar12) {
        uVar9 = uVar12;
      }
      if ((*(ulong *)(lVar4 + ((long)uVar9 >> 6) * 8 + -8 +
                     (ulong)((uVar12 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
           (uVar12 & 0x3f) & 1) == 0) {
        uVar12 = (ulong)(ppAVar3[1]->super_StuntDouble).globalIndex_;
        uVar9 = uVar12 + 0x3f;
        if (-1 < (long)uVar12) {
          uVar9 = uVar12;
        }
        if ((*(ulong *)(lVar4 + ((long)uVar9 >> 6) * 8 + -8 +
                       (ulong)((uVar12 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
             (uVar12 & 0x3f) & 1) == 0) goto LAB_0012fb26;
      }
      local_78[0] = pBVar14->potential_ + local_78[0];
    }
LAB_0012fb26:
    if (ppBVar17 ==
        (local_100->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pBVar14 = (Bond *)0x0;
    }
    else {
      pBVar14 = *ppBVar17;
    }
  }
  ppBVar18 = (local_100->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppBVar18 ==
      (local_100->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pIVar15 = (Inversion *)0x0;
  }
  else {
    pIVar15 = (Inversion *)*ppBVar18;
  }
  if (pIVar15 != (Inversion *)0x0) {
    local_108 = (_Rb_tree<OpenMD::Bend*,std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>,std::_Select1st<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>,std::less<OpenMD::Bend*>,std::allocator<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>>
                 *)&this->bendDataSets;
    p_Var1 = &(this->bendDataSets)._M_t._M_impl.super__Rb_tree_header;
    do {
      (*(pIVar15->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[9])
                (pIVar15,&local_110,(ulong)this->doParticlePot_);
      pIVar2 = pIVar15->inversionType_;
      local_c0 = local_c0 + (double)pIVar2;
      p_Var5 = (this->bendDataSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var7 = &p_Var1->_M_header;
      for (; (_Rb_tree_header *)p_Var5 != (_Rb_tree_header *)0x0;
          p_Var5 = (&p_Var5->_M_left)[*(Inversion **)(p_Var5 + 1) < pIVar15]) {
        if (*(Inversion **)(p_Var5 + 1) >= pIVar15) {
          p_Var7 = p_Var5;
        }
      }
      p_Var8 = p_Var1;
      if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
         (p_Var8 = (_Rb_tree_header *)p_Var7,
         pIVar15 < (Inversion *)((_Rb_tree_header *)p_Var7)->_M_node_count)) {
        p_Var8 = p_Var1;
      }
      if (p_Var8 == p_Var1) {
        local_f8.second.deltaV = 0.0;
        local_f8.second.prev.angle = local_110;
        local_f8.second.curr.angle = local_110;
        local_f8.first = pIVar15;
        local_f8.second.prev.potential = (RealType)pIVar2;
        local_f8.second.curr.potential = (RealType)pIVar2;
        std::
        _Rb_tree<OpenMD::Bend*,std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>,std::_Select1st<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>,std::less<OpenMD::Bend*>,std::allocator<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>>
        ::_M_insert_unique<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>
                  (local_108,(pair<OpenMD::Bend_*const,_OpenMD::BendDataSet> *)&local_f8);
      }
      else {
        dVar6 = *(double *)((long)(p_Var8 + 1) + 0x20);
        *(undefined8 *)((long)(p_Var8 + 1) + 8) = *(undefined8 *)((long)(p_Var8 + 1) + 0x18);
        *(double *)((long)(p_Var8 + 1) + 0x10) = dVar6;
        *(RealType *)((long)(p_Var8 + 1) + 0x18) = local_110;
        *(InversionType **)((long)(p_Var8 + 1) + 0x20) = pIVar2;
        *(double *)(p_Var8 + 1) = ABS((double)pIVar2 - dVar6);
      }
      if (this->doPotentialSelection_ == true) {
        ppAVar3 = (pIVar15->super_ShortRangeInteraction).atoms_.
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar12 = (ulong)((*ppAVar3)->super_StuntDouble).globalIndex_;
        lVar4 = *(long *)&(((this->seleMan_).ss_.bitsets_.
                            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                            ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                          super__Bvector_base<std::allocator<bool>_>;
        uVar9 = uVar12 + 0x3f;
        if (-1 < (long)uVar12) {
          uVar9 = uVar12;
        }
        if ((*(ulong *)(lVar4 + ((long)uVar9 >> 6) * 8 + -8 +
                       (ulong)((uVar12 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
             (uVar12 & 0x3f) & 1) == 0) {
          uVar12 = (ulong)(ppAVar3[1]->super_StuntDouble).globalIndex_;
          uVar9 = uVar12 + 0x3f;
          if (-1 < (long)uVar12) {
            uVar9 = uVar12;
          }
          if ((*(ulong *)(lVar4 + ((long)uVar9 >> 6) * 8 + -8 +
                         (ulong)((uVar12 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
               (uVar12 & 0x3f) & 1) == 0) {
            uVar12 = (ulong)(ppAVar3[2]->super_StuntDouble).globalIndex_;
            uVar9 = uVar12 + 0x3f;
            if (-1 < (long)uVar12) {
              uVar9 = uVar12;
            }
            if ((*(ulong *)(lVar4 + ((long)uVar9 >> 6) * 8 + -8 +
                           (ulong)((uVar12 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                 (uVar12 & 0x3f) & 1) == 0) goto LAB_0012fd4a;
          }
        }
        local_78[0] = (double)pIVar15->inversionType_ + local_78[0];
      }
LAB_0012fd4a:
      ppBVar18 = ppBVar18 + 1;
      if (ppBVar18 ==
          (local_100->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pIVar15 = (Inversion *)0x0;
      }
      else {
        pIVar15 = (Inversion *)*ppBVar18;
      }
    } while (pIVar15 != (Inversion *)0x0);
  }
  ppTVar10 = (local_100->torsions_).
             super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppTVar10 ==
      (local_100->torsions_).
      super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pIVar15 = (Inversion *)0x0;
  }
  else {
    pIVar15 = (Inversion *)*ppTVar10;
  }
  if (pIVar15 != (Inversion *)0x0) {
    local_108 = (_Rb_tree<OpenMD::Bend*,std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>,std::_Select1st<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>,std::less<OpenMD::Bend*>,std::allocator<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>>
                 *)&this->torsionDataSets;
    p_Var1 = &(this->torsionDataSets)._M_t._M_impl.super__Rb_tree_header;
    do {
      (*(pIVar15->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[9])
                (pIVar15,&local_110,(ulong)this->doParticlePot_);
      pIVar2 = *(InversionType **)((long)&(pIVar15->name_).field_2 + 8);
      local_c8 = local_c8 + (double)pIVar2;
      p_Var5 = (this->torsionDataSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var7 = &p_Var1->_M_header;
      for (; (_Rb_tree_header *)p_Var5 != (_Rb_tree_header *)0x0;
          p_Var5 = (&p_Var5->_M_left)[*(Inversion **)(p_Var5 + 1) < pIVar15]) {
        if (*(Inversion **)(p_Var5 + 1) >= pIVar15) {
          p_Var7 = p_Var5;
        }
      }
      p_Var8 = p_Var1;
      if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
         (p_Var8 = (_Rb_tree_header *)p_Var7,
         pIVar15 < (Inversion *)((_Rb_tree_header *)p_Var7)->_M_node_count)) {
        p_Var8 = p_Var1;
      }
      if (p_Var8 == p_Var1) {
        local_f8.second.deltaV = 0.0;
        local_f8.second.prev.angle = local_110;
        local_f8.second.curr.angle = local_110;
        local_f8.first = pIVar15;
        local_f8.second.prev.potential = (RealType)pIVar2;
        local_f8.second.curr.potential = (RealType)pIVar2;
        std::
        _Rb_tree<OpenMD::Torsion*,std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>,std::_Select1st<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>,std::less<OpenMD::Torsion*>,std::allocator<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>>
        ::_M_insert_unique<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>
                  ((_Rb_tree<OpenMD::Torsion*,std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>,std::_Select1st<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>,std::less<OpenMD::Torsion*>,std::allocator<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>>
                    *)local_108,(pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet> *)&local_f8);
      }
      else {
        dVar6 = *(double *)((long)(p_Var8 + 1) + 0x20);
        *(undefined8 *)((long)(p_Var8 + 1) + 8) = *(undefined8 *)((long)(p_Var8 + 1) + 0x18);
        *(double *)((long)(p_Var8 + 1) + 0x10) = dVar6;
        *(RealType *)((long)(p_Var8 + 1) + 0x18) = local_110;
        *(InversionType **)((long)(p_Var8 + 1) + 0x20) = pIVar2;
        *(double *)(p_Var8 + 1) = ABS((double)pIVar2 - dVar6);
      }
      if (this->doPotentialSelection_ == true) {
        ppAVar3 = (pIVar15->super_ShortRangeInteraction).atoms_.
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar12 = (ulong)((*ppAVar3)->super_StuntDouble).globalIndex_;
        lVar4 = *(long *)&(((this->seleMan_).ss_.bitsets_.
                            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                            ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                          super__Bvector_base<std::allocator<bool>_>;
        uVar9 = uVar12 + 0x3f;
        if (-1 < (long)uVar12) {
          uVar9 = uVar12;
        }
        if ((*(ulong *)(lVar4 + ((long)uVar9 >> 6) * 8 + -8 +
                       (ulong)((uVar12 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
             (uVar12 & 0x3f) & 1) == 0) {
          uVar12 = (ulong)(ppAVar3[1]->super_StuntDouble).globalIndex_;
          uVar9 = uVar12 + 0x3f;
          if (-1 < (long)uVar12) {
            uVar9 = uVar12;
          }
          if ((*(ulong *)(lVar4 + ((long)uVar9 >> 6) * 8 + -8 +
                         (ulong)((uVar12 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
               (uVar12 & 0x3f) & 1) == 0) {
            uVar12 = (ulong)(ppAVar3[2]->super_StuntDouble).globalIndex_;
            uVar9 = uVar12 + 0x3f;
            if (-1 < (long)uVar12) {
              uVar9 = uVar12;
            }
            if ((*(ulong *)(lVar4 + ((long)uVar9 >> 6) * 8 + -8 +
                           (ulong)((uVar12 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                 (uVar12 & 0x3f) & 1) == 0) {
              uVar12 = (ulong)(ppAVar3[3]->super_StuntDouble).globalIndex_;
              uVar9 = uVar12 + 0x3f;
              if (-1 < (long)uVar12) {
                uVar9 = uVar12;
              }
              if ((*(ulong *)(lVar4 + ((long)uVar9 >> 6) * 8 + -8 +
                             (ulong)((uVar12 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                   (uVar12 & 0x3f) & 1) == 0) goto LAB_0012ffaf;
            }
          }
        }
        local_78[0] = *(double *)((long)&(pIVar15->name_).field_2 + 8) + local_78[0];
      }
LAB_0012ffaf:
      ppTVar10 = ppTVar10 + 1;
      if (ppTVar10 ==
          (local_100->torsions_).
          super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pIVar15 = (Inversion *)0x0;
      }
      else {
        pIVar15 = (Inversion *)*ppTVar10;
      }
    } while (pIVar15 != (Inversion *)0x0);
  }
  ppIVar11 = (local_100->inversions_).
             super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppIVar11 ==
      (local_100->inversions_).
      super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pIVar15 = (Inversion *)0x0;
  }
  else {
    pIVar15 = *ppIVar11;
  }
  if (pIVar15 != (Inversion *)0x0) {
    local_108 = (_Rb_tree<OpenMD::Bend*,std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>,std::_Select1st<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>,std::less<OpenMD::Bend*>,std::allocator<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>>
                 *)&this->inversionDataSets;
    p_Var1 = &(this->inversionDataSets)._M_t._M_impl.super__Rb_tree_header;
    do {
      (*(pIVar15->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[9])
                (pIVar15,&local_110,(ulong)this->doParticlePot_);
      pIVar2 = (InversionType *)pIVar15->potential_;
      local_b0 = local_b0 + (double)pIVar2;
      p_Var5 = (this->inversionDataSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var7 = &p_Var1->_M_header;
      for (; (_Rb_tree_header *)p_Var5 != (_Rb_tree_header *)0x0;
          p_Var5 = (&p_Var5->_M_left)[*(Inversion **)(p_Var5 + 1) < pIVar15]) {
        if (*(Inversion **)(p_Var5 + 1) >= pIVar15) {
          p_Var7 = p_Var5;
        }
      }
      p_Var8 = p_Var1;
      if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
         (p_Var8 = (_Rb_tree_header *)p_Var7,
         pIVar15 < (Inversion *)((_Rb_tree_header *)p_Var7)->_M_node_count)) {
        p_Var8 = p_Var1;
      }
      if (p_Var8 == p_Var1) {
        local_f8.second.deltaV = 0.0;
        local_f8.second.prev.angle = local_110;
        local_f8.second.curr.angle = local_110;
        local_f8.first = pIVar15;
        local_f8.second.prev.potential = (RealType)pIVar2;
        local_f8.second.curr.potential = (RealType)pIVar2;
        std::
        _Rb_tree<OpenMD::Inversion*,std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>,std::_Select1st<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>,std::less<OpenMD::Inversion*>,std::allocator<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>>
        ::_M_insert_unique<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>
                  ((_Rb_tree<OpenMD::Inversion*,std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>,std::_Select1st<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>,std::less<OpenMD::Inversion*>,std::allocator<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>>
                    *)local_108,&local_f8);
      }
      else {
        dVar6 = *(double *)((long)(p_Var8 + 1) + 0x20);
        *(undefined8 *)((long)(p_Var8 + 1) + 8) = *(undefined8 *)((long)(p_Var8 + 1) + 0x18);
        *(double *)((long)(p_Var8 + 1) + 0x10) = dVar6;
        *(RealType *)((long)(p_Var8 + 1) + 0x18) = local_110;
        *(InversionType **)((long)(p_Var8 + 1) + 0x20) = pIVar2;
        *(double *)(p_Var8 + 1) = ABS((double)pIVar2 - dVar6);
      }
      if (this->doPotentialSelection_ == true) {
        ppAVar3 = (pIVar15->super_ShortRangeInteraction).atoms_.
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar12 = (ulong)((*ppAVar3)->super_StuntDouble).globalIndex_;
        lVar4 = *(long *)&(((this->seleMan_).ss_.bitsets_.
                            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                            ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                          super__Bvector_base<std::allocator<bool>_>;
        uVar9 = uVar12 + 0x3f;
        if (-1 < (long)uVar12) {
          uVar9 = uVar12;
        }
        if ((*(ulong *)(lVar4 + ((long)uVar9 >> 6) * 8 + -8 +
                       (ulong)((uVar12 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
             (uVar12 & 0x3f) & 1) == 0) {
          uVar12 = (ulong)(ppAVar3[1]->super_StuntDouble).globalIndex_;
          uVar9 = uVar12 + 0x3f;
          if (-1 < (long)uVar12) {
            uVar9 = uVar12;
          }
          if ((*(ulong *)(lVar4 + ((long)uVar9 >> 6) * 8 + -8 +
                         (ulong)((uVar12 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
               (uVar12 & 0x3f) & 1) == 0) {
            uVar12 = (ulong)(ppAVar3[2]->super_StuntDouble).globalIndex_;
            uVar9 = uVar12 + 0x3f;
            if (-1 < (long)uVar12) {
              uVar9 = uVar12;
            }
            if ((*(ulong *)(lVar4 + ((long)uVar9 >> 6) * 8 + -8 +
                           (ulong)((uVar12 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                 (uVar12 & 0x3f) & 1) == 0) {
              uVar12 = (ulong)(ppAVar3[3]->super_StuntDouble).globalIndex_;
              uVar9 = uVar12 + 0x3f;
              if (-1 < (long)uVar12) {
                uVar9 = uVar12;
              }
              if ((*(ulong *)(lVar4 + ((long)uVar9 >> 6) * 8 + -8 +
                             (ulong)((uVar12 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                   (uVar12 & 0x3f) & 1) == 0) goto LAB_00130215;
            }
          }
        }
        local_78[0] = pIVar15->potential_ + local_78[0];
      }
LAB_00130215:
      ppIVar11 = ppIVar11 + 1;
      if (ppIVar11 ==
          (local_100->inversions_).
          super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pIVar15 = (Inversion *)0x0;
      }
      else {
        pIVar15 = *ppIVar11;
      }
    } while (pIVar15 != (Inversion *)0x0);
  }
  MPI_Allreduce(1,&local_b8,1,&ompi_mpi_double,&ompi_mpi_op_sum,&ompi_mpi_comm_world);
  MPI_Allreduce(1,&local_c0,1,&ompi_mpi_double,&ompi_mpi_op_sum,&ompi_mpi_comm_world);
  MPI_Allreduce(1,&local_c8,1,&ompi_mpi_double,&ompi_mpi_op_sum,&ompi_mpi_comm_world);
  MPI_Allreduce(1,&local_b0,1,&ompi_mpi_double,&ompi_mpi_op_sum,&ompi_mpi_comm_world);
  MPI_Allreduce(1,local_78,1,&ompi_mpi_double,&ompi_mpi_op_sum,&ompi_mpi_comm_world);
  this_00 = this->info_->sman_->currentSnapshot_;
  Snapshot::setBondPotential(this_00,local_b8);
  Snapshot::setBendPotential(this_00,local_c0);
  Snapshot::setTorsionPotential(this_00,local_c8);
  Snapshot::setInversionPotential(this_00,local_b0);
  local_68.data_[6] = local_78[0];
  local_68.data_[4] = local_88;
  local_68.data_[5] = dStack_80;
  local_68.data_[2] = local_98;
  local_68.data_[3] = dStack_90;
  local_68.data_[0] = local_a8;
  local_68.data_[1] = dStack_a0;
  Snapshot::setSelectionPotentials(this_00,&local_68);
  return;
}

Assistant:

void ForceManager::selectedShortRangeInteractions(Molecule* mol1,
                                                    Molecule* mol2) {
    RigidBody* rb;
    Bond* bond;
    Bend* bend;
    Torsion* torsion;
    Inversion* inversion;
    SimInfo::MoleculeIterator mi;
    Molecule::RigidBodyIterator rbIter;
    Molecule::BondIterator bondIter;
    Molecule::BendIterator bendIter;
    Molecule::TorsionIterator torsionIter;
    Molecule::InversionIterator inversionIter;
    RealType bondPotential      = 0.0;
    RealType bendPotential      = 0.0;
    RealType torsionPotential   = 0.0;
    RealType inversionPotential = 0.0;
    potVec selectionPotential(0.0);

    // First compute for mol1
    for (rb = mol1->beginRigidBody(rbIter); rb != NULL;
         rb = mol1->nextRigidBody(rbIter)) {
      rb->updateAtoms();
    }

    for (bond = mol1->beginBond(bondIter); bond != NULL;
         bond = mol1->nextBond(bondIter)) {
      bond->calcForce(doParticlePot_);
      bondPotential += bond->getPotential();
      if (doPotentialSelection_) {
        if (seleMan_.isSelected(bond->getAtomA()) ||
            seleMan_.isSelected(bond->getAtomB())) {
          selectionPotential[BONDED_FAMILY] += bond->getPotential();
        }
      }
    }

    for (bend = mol1->beginBend(bendIter); bend != NULL;
         bend = mol1->nextBend(bendIter)) {
      RealType angle;
      bend->calcForce(angle, doParticlePot_);
      RealType currBendPot = bend->getPotential();

      bendPotential += bend->getPotential();
      map<Bend*, BendDataSet>::iterator i = bendDataSets.find(bend);
      if (i == bendDataSets.end()) {
        BendDataSet dataSet;
        dataSet.prev.angle = dataSet.curr.angle = angle;
        dataSet.prev.potential = dataSet.curr.potential = currBendPot;
        dataSet.deltaV                                  = 0.0;
        bendDataSets.insert(map<Bend*, BendDataSet>::value_type(bend, dataSet));
      } else {
        i->second.prev.angle     = i->second.curr.angle;
        i->second.prev.potential = i->second.curr.potential;
        i->second.curr.angle     = angle;
        i->second.curr.potential = currBendPot;
        i->second.deltaV =
            fabs(i->second.curr.potential - i->second.prev.potential);
      }
      if (doPotentialSelection_) {
        if (seleMan_.isSelected(bend->getAtomA()) ||
            seleMan_.isSelected(bend->getAtomB()) ||
            seleMan_.isSelected(bend->getAtomC())) {
          selectionPotential[BONDED_FAMILY] += bend->getPotential();
        }
      }
    }

    for (torsion = mol1->beginTorsion(torsionIter); torsion != NULL;
         torsion = mol1->nextTorsion(torsionIter)) {
      RealType angle;
      torsion->calcForce(angle, doParticlePot_);
      RealType currTorsionPot = torsion->getPotential();
      torsionPotential += torsion->getPotential();
      map<Torsion*, TorsionDataSet>::iterator i = torsionDataSets.find(torsion);
      if (i == torsionDataSets.end()) {
        TorsionDataSet dataSet;
        dataSet.prev.angle = dataSet.curr.angle = angle;
        dataSet.prev.potential = dataSet.curr.potential = currTorsionPot;
        dataSet.deltaV                                  = 0.0;
        torsionDataSets.insert(
            map<Torsion*, TorsionDataSet>::value_type(torsion, dataSet));
      } else {
        i->second.prev.angle     = i->second.curr.angle;
        i->second.prev.potential = i->second.curr.potential;
        i->second.curr.angle     = angle;
        i->second.curr.potential = currTorsionPot;
        i->second.deltaV =
            fabs(i->second.curr.potential - i->second.prev.potential);
      }
      if (doPotentialSelection_) {
        if (seleMan_.isSelected(torsion->getAtomA()) ||
            seleMan_.isSelected(torsion->getAtomB()) ||
            seleMan_.isSelected(torsion->getAtomC()) ||
            seleMan_.isSelected(torsion->getAtomD())) {
          selectionPotential[BONDED_FAMILY] += torsion->getPotential();
        }
      }
    }

    for (inversion = mol1->beginInversion(inversionIter); inversion != NULL;
         inversion = mol1->nextInversion(inversionIter)) {
      RealType angle;
      inversion->calcForce(angle, doParticlePot_);
      RealType currInversionPot = inversion->getPotential();
      inversionPotential += inversion->getPotential();
      map<Inversion*, InversionDataSet>::iterator i =
          inversionDataSets.find(inversion);
      if (i == inversionDataSets.end()) {
        InversionDataSet dataSet;
        dataSet.prev.angle = dataSet.curr.angle = angle;
        dataSet.prev.potential = dataSet.curr.potential = currInversionPot;
        dataSet.deltaV                                  = 0.0;
        inversionDataSets.insert(
            map<Inversion*, InversionDataSet>::value_type(inversion, dataSet));
      } else {
        i->second.prev.angle     = i->second.curr.angle;
        i->second.prev.potential = i->second.curr.potential;
        i->second.curr.angle     = angle;
        i->second.curr.potential = currInversionPot;
        i->second.deltaV =
            fabs(i->second.curr.potential - i->second.prev.potential);
      }
      if (doPotentialSelection_) {
        if (seleMan_.isSelected(inversion->getAtomA()) ||
            seleMan_.isSelected(inversion->getAtomB()) ||
            seleMan_.isSelected(inversion->getAtomC()) ||
            seleMan_.isSelected(inversion->getAtomD())) {
          selectionPotential[BONDED_FAMILY] += inversion->getPotential();
        }
      }
    }

    // Next compute for mol2
    for (rb = mol2->beginRigidBody(rbIter); rb != NULL;
         rb = mol2->nextRigidBody(rbIter)) {
      rb->updateAtoms();
    }

    for (bond = mol2->beginBond(bondIter); bond != NULL;
         bond = mol2->nextBond(bondIter)) {
      bond->calcForce(doParticlePot_);
      bondPotential += bond->getPotential();
      if (doPotentialSelection_) {
        if (seleMan_.isSelected(bond->getAtomA()) ||
            seleMan_.isSelected(bond->getAtomB())) {
          selectionPotential[BONDED_FAMILY] += bond->getPotential();
        }
      }
    }

    for (bend = mol2->beginBend(bendIter); bend != NULL;
         bend = mol2->nextBend(bendIter)) {
      RealType angle;
      bend->calcForce(angle, doParticlePot_);
      RealType currBendPot = bend->getPotential();

      bendPotential += bend->getPotential();
      map<Bend*, BendDataSet>::iterator i = bendDataSets.find(bend);
      if (i == bendDataSets.end()) {
        BendDataSet dataSet;
        dataSet.prev.angle = dataSet.curr.angle = angle;
        dataSet.prev.potential = dataSet.curr.potential = currBendPot;
        dataSet.deltaV                                  = 0.0;
        bendDataSets.insert(map<Bend*, BendDataSet>::value_type(bend, dataSet));
      } else {
        i->second.prev.angle     = i->second.curr.angle;
        i->second.prev.potential = i->second.curr.potential;
        i->second.curr.angle     = angle;
        i->second.curr.potential = currBendPot;
        i->second.deltaV =
            fabs(i->second.curr.potential - i->second.prev.potential);
      }
      if (doPotentialSelection_) {
        if (seleMan_.isSelected(bend->getAtomA()) ||
            seleMan_.isSelected(bend->getAtomB()) ||
            seleMan_.isSelected(bend->getAtomC())) {
          selectionPotential[BONDED_FAMILY] += bend->getPotential();
        }
      }
    }

    for (torsion = mol2->beginTorsion(torsionIter); torsion != NULL;
         torsion = mol2->nextTorsion(torsionIter)) {
      RealType angle;
      torsion->calcForce(angle, doParticlePot_);
      RealType currTorsionPot = torsion->getPotential();
      torsionPotential += torsion->getPotential();
      map<Torsion*, TorsionDataSet>::iterator i = torsionDataSets.find(torsion);
      if (i == torsionDataSets.end()) {
        TorsionDataSet dataSet;
        dataSet.prev.angle = dataSet.curr.angle = angle;
        dataSet.prev.potential = dataSet.curr.potential = currTorsionPot;
        dataSet.deltaV                                  = 0.0;
        torsionDataSets.insert(
            map<Torsion*, TorsionDataSet>::value_type(torsion, dataSet));
      } else {
        i->second.prev.angle     = i->second.curr.angle;
        i->second.prev.potential = i->second.curr.potential;
        i->second.curr.angle     = angle;
        i->second.curr.potential = currTorsionPot;
        i->second.deltaV =
            fabs(i->second.curr.potential - i->second.prev.potential);
      }
      if (doPotentialSelection_) {
        if (seleMan_.isSelected(torsion->getAtomA()) ||
            seleMan_.isSelected(torsion->getAtomB()) ||
            seleMan_.isSelected(torsion->getAtomC()) ||
            seleMan_.isSelected(torsion->getAtomD())) {
          selectionPotential[BONDED_FAMILY] += torsion->getPotential();
        }
      }
    }

    for (inversion = mol2->beginInversion(inversionIter); inversion != NULL;
         inversion = mol2->nextInversion(inversionIter)) {
      RealType angle;
      inversion->calcForce(angle, doParticlePot_);
      RealType currInversionPot = inversion->getPotential();
      inversionPotential += inversion->getPotential();
      map<Inversion*, InversionDataSet>::iterator i =
          inversionDataSets.find(inversion);
      if (i == inversionDataSets.end()) {
        InversionDataSet dataSet;
        dataSet.prev.angle = dataSet.curr.angle = angle;
        dataSet.prev.potential = dataSet.curr.potential = currInversionPot;
        dataSet.deltaV                                  = 0.0;
        inversionDataSets.insert(
            map<Inversion*, InversionDataSet>::value_type(inversion, dataSet));
      } else {
        i->second.prev.angle     = i->second.curr.angle;
        i->second.prev.potential = i->second.curr.potential;
        i->second.curr.angle     = angle;
        i->second.curr.potential = currInversionPot;
        i->second.deltaV =
            fabs(i->second.curr.potential - i->second.prev.potential);
      }
      if (doPotentialSelection_) {
        if (seleMan_.isSelected(inversion->getAtomA()) ||
            seleMan_.isSelected(inversion->getAtomB()) ||
            seleMan_.isSelected(inversion->getAtomC()) ||
            seleMan_.isSelected(inversion->getAtomD())) {
          selectionPotential[BONDED_FAMILY] += inversion->getPotential();
        }
      }
    }

#ifdef IS_MPI
    // Collect from all nodes.  This should eventually be moved into a
    // SystemDecomposition, but this is a better place than in
    // Thermo to do the collection.

    MPI_Allreduce(MPI_IN_PLACE, &bondPotential, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &bendPotential, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &torsionPotential, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &inversionPotential, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &selectionPotential[BONDED_FAMILY], 1,
                  MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);
#endif

    Snapshot* curSnapshot = info_->getSnapshotManager()->getCurrentSnapshot();

    curSnapshot->setBondPotential(bondPotential);
    curSnapshot->setBendPotential(bendPotential);
    curSnapshot->setTorsionPotential(torsionPotential);
    curSnapshot->setInversionPotential(inversionPotential);
    curSnapshot->setSelectionPotentials(selectionPotential);

    // RealType shortRangePotential = bondPotential + bendPotential +
    //   torsionPotential +  inversionPotential;

    // curSnapshot->setShortRangePotential(shortRangePotential);
  }